

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_phone_list.c
# Opt level: O0

acmod_id_t * mk_word_phone_list(char **btw_mark,uint32 *n_phone,char *word,lexicon_t *lex)

{
  uint uVar1;
  lex_entry_t *plVar2;
  char *pcVar3;
  acmod_id_t *p;
  uint i;
  char *btw;
  lex_entry_t *e;
  uint32 n_p;
  lexicon_t *lex_local;
  char *word_local;
  uint32 *n_phone_local;
  char **btw_mark_local;
  
  plVar2 = lexicon_lookup(lex,word);
  if (plVar2 == (lex_entry_t *)0x0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
            ,0xec,"Unable to lookup word \'%s\' in the dictionary\n",word);
    btw_mark_local = (char **)0x0;
  }
  else {
    uVar1 = plVar2->phone_cnt;
    btw_mark_local =
         (char **)__ckd_calloc__((ulong)uVar1,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
                                 ,0xf5);
    pcVar3 = (char *)__ckd_calloc__((ulong)uVar1,1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
                                    ,0xfa);
    if (uVar1 != 0) {
      for (p._4_4_ = 0; p._4_4_ < uVar1; p._4_4_ = p._4_4_ + 1) {
        *(acmod_id_t *)((long)btw_mark_local + (ulong)p._4_4_ * 4) = plVar2->ci_acmod_id[p._4_4_];
      }
      pcVar3[uVar1 - 1] = '\x01';
    }
    *btw_mark = pcVar3;
    *n_phone = uVar1;
  }
  return (acmod_id_t *)btw_mark_local;
}

Assistant:

acmod_id_t *
mk_word_phone_list(char **btw_mark,
		   uint32 *n_phone,
		   char *word,
		   lexicon_t *lex)
{
  uint32 n_p;
  lex_entry_t *e;
  char *btw;
  unsigned int i;
  acmod_id_t *p;
  
  /*
   * Determine the # of phones in the word.
   */
  
  e = lexicon_lookup(lex, word);
  if (e == NULL) {
    E_WARN("Unable to lookup word '%s' in the dictionary\n", word);
    
    return NULL;
  }
  n_p = e->phone_cnt;
  
  /*
   * Allocate the phone sequence
   */
  p = ckd_calloc(n_p, sizeof(acmod_id_t));
  
  /*
   * Allocate the between word markers
   */
  btw = ckd_calloc(n_p, sizeof(char));
  
  if (n_p != 0)
    {
      for (i = 0; i < n_p; i++) {
	p[i] = e->ci_acmod_id[i];
      }
      
      btw[n_p-1] = TRUE;/* mark word boundary following
			   kth phone */
    }
  
  *btw_mark = btw;
  *n_phone = n_p;
  
  return p;
}